

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall MemoryManager::printInfo(MemoryManager *this)

{
  long in_RDI;
  uint32_t j;
  uint32_t i;
  uint local_10;
  uint local_c;
  
  printf("Memory Pages: \n");
  for (local_c = 0; local_c < 0x400; local_c = local_c + 1) {
    if (*(long *)(in_RDI + (ulong)local_c * 8) != 0) {
      printf("0x%x-0x%x:\n",(ulong)(local_c << 0x16),(ulong)((local_c + 1) * 0x400000));
      for (local_10 = 0; local_10 < 0x400; local_10 = local_10 + 1) {
        if (*(long *)(*(long *)(in_RDI + (ulong)local_c * 8) + (ulong)local_10 * 8) != 0) {
          printf("  0x%x-0x%x\n",(ulong)(local_c * 0x400000 + local_10 * 0x1000),
                 (ulong)(local_c * 0x400000 + (local_10 + 1) * 0x1000));
        }
      }
    }
  }
  return;
}

Assistant:

void MemoryManager::printInfo() {
  printf("Memory Pages: \n");
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] == nullptr) {
      continue;
    }
    printf("0x%x-0x%x:\n", i << 22, (i + 1) << 22);
    for (uint32_t j = 0; j < 1024; ++j) {
      if (this->memory[i][j] == nullptr) {
        continue;
      }
      printf("  0x%x-0x%x\n", (i << 22) + (j << 12),
             (i << 22) + ((j + 1) << 12));
    }
  }
}